

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::iterate
          (BinaryAtomicOperationCase *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  TextureType TVar6;
  ChannelType CVar7;
  AtomicOperation AVar8;
  AtomicOperationCaseType AVar9;
  AtomicOperationCaseType AVar10;
  Functional *this_00;
  TestLog *log;
  BinaryAtomicOperationCase *pBVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  ContextType type;
  GLSLVersion version;
  Functions *gl;
  undefined4 extraout_var;
  long lVar14;
  bool *pbVar15;
  ProgramSources *sources;
  undefined8 uVar16;
  ImageLayerVerifier *verifyLayer;
  char *pcVar17;
  char *pcVar18;
  TextureFormat *format;
  RenderContext *renderContext;
  GLuint GVar19;
  int y;
  int iVar20;
  bool *pbVar21;
  char *__s;
  LayeredImage *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  int x;
  int iVar22;
  GLuint z;
  bool bVar23;
  _func_int **pp_Var24;
  Vector<int,_3> local_7a8;
  TestLog *local_798;
  GLuint local_78c;
  CallLogWrapper glLog;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  string glslVersionDeclaration;
  string atomicInvocation;
  undefined1 local_6e0 [40];
  TextureFormat *local_6b8;
  undefined8 local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  Texture returnValueTexture;
  Texture endResultTexture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  BinaryAtomicOperationCase *local_558;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string atomicCoord;
  LayeredImage imageData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  IVec4 initial;
  GLuint local_298;
  bool local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string atomicArgExpr;
  string invocationCoord;
  string colorVecTypeName;
  
  this_00 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  gl = (Functions *)(**(code **)(*(long *)this_00 + 0x18))(this_00);
  local_798 = log;
  glu::CallLogWrapper::CallLogWrapper(&glLog,gl,log);
  dVar12 = glu::getInternalFormat(this->m_format);
  local_6b0 = CONCAT44(extraout_var,dVar12);
  TVar6 = this->m_imageType;
  dVar12 = getGLTextureTarget(TVar6);
  defaultImageSize((Functional *)&local_7a8,TVar6);
  CVar7 = (this->m_format).type;
  local_78c = local_7a8.m_data[2];
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    local_78c = 6;
  }
  bVar23 = (CVar7 & ~SNORM_INT16) != UNSIGNED_INT8;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&endResultTextureBuf,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&returnValueTextureBuf,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&endResultTexture,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&returnValueTexture,(RenderContext *)this_00);
  glLog.m_enableLog = true;
  poVar1 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_798;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,") to act as the target of atomic operations");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_798;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Created a buffer for the texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_798;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Created a texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,
                    ") to which the intermediate return values of the atomic operation are stored");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      poVar1 = (ostringstream *)(initial.m_data + 2);
      initial.m_data._0_8_ = local_798;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// Created a buffer for the texture (name ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
  }
  local_6b8 = &this->m_format;
  LayeredImage::LayeredImage
            (&imageData,this->m_imageType,local_6b8,local_7a8.m_data[0],local_7a8.m_data[1],
             local_7a8.m_data[2]);
  if ((ulong)this->m_operation < 7) {
    iVar20 = *(int *)(&DAT_0189f8bc + (ulong)this->m_operation * 4);
  }
  else {
    iVar20 = -1;
  }
  local_558 = this;
  tcu::Vector<int,_4>::Vector(&initial,iVar20);
  z = 0;
  GVar19 = 0;
  if (0 < (int)local_78c) {
    GVar19 = local_78c;
  }
  for (; z != GVar19; z = z + 1) {
    for (iVar20 = 0; iVar20 < local_7a8.m_data[1]; iVar20 = iVar20 + 1) {
      for (iVar22 = 0; iVar22 < local_7a8.m_data[0]; iVar22 = iVar22 + 1) {
        Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                  ((LayeredImage *)&imageData,iVar22,iVar20,z,&initial);
      }
    }
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  pBVar11 = local_558;
  uVar16 = local_6b0;
  glu::CallLogWrapper::glBindTexture(&glLog,dVar12,endResultTexture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,dVar12);
  poVar1 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_798;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "// Filling end-result texture with initial pattern (initial value ");
  if ((ulong)pBVar11->m_operation < 7) {
    iVar20 = *(int *)(&DAT_0189f8bc + (ulong)pBVar11->m_operation * 4);
  }
  else {
    iVar20 = -1;
  }
  std::ostream::operator<<(poVar1,iVar20);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,(GLenum)uVar16
            );
  lVar14 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x7c0);
  if (pBVar11->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,dVar12,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,dVar12);
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_798;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Setting storage of return-value texture");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    TVar6 = pBVar11->m_imageType;
    imageData.m_size.m_data[0] = (uint)(TVar6 == TEXTURETYPE_CUBE) * 4 + 1;
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[1] = 1;
    tcu::operator*((tcu *)&initial,&local_7a8,(Vector<int,_3> *)&imageData);
    dVar12 = (deUint32)local_6b0;
    setTextureStorage(&glLog,TVar6,dVar12,(IVec3 *)&initial,
                      returnValueTextureBuf.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar12);
    lVar14 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar12 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar12,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,2000);
  }
  pbVar15 = (bool *)0x18936c1;
  if (2 < CVar7 - SIGNED_INT8) {
    pbVar15 = glcts::fixed_sample_locations_values + 1;
  }
  pbVar21 = (bool *)0x1727a24;
  if (CVar7 != UNSIGNED_INT32 && bVar23) {
    pbVar21 = pbVar15;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&initial,pbVar21,(allocator<char> *)&imageData);
  std::operator+(&colorVecTypeName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                 "vec4");
  std::__cxx11::string::~string((string *)&initial);
  if (pBVar11->m_imageType == TEXTURETYPE_2D) {
    atomicInvocation._M_dataplus._M_p._0_4_ = local_7a8.m_data[0];
    de::toString<int>((string *)&imageData,(int *)&atomicInvocation);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                   "ivec2(gx % ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData);
    std::operator+(&atomicCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                   ", gy)");
LAB_01253cf2:
    std::__cxx11::string::~string((string *)&initial);
    this_01 = &imageData;
  }
  else {
    if (pBVar11->m_imageType != TEXTURETYPE_BUFFER) {
      shaderImageFormatStr._M_dataplus._M_p._0_4_ = local_7a8.m_data[0];
      de::toString<int>((string *)&imageData,(int *)&shaderImageFormatStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                     "ivec3(gx % ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData
                    );
      std::operator+(&atomicCoord,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                     ", gy, gz)");
      goto LAB_01253cf2;
    }
    local_6e0._0_4_ = local_7a8.m_data[0];
    de::toString<int>((string *)&initial,(int *)local_6e0);
    std::operator+(&atomicCoord,"gx % ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial);
    this_01 = (LayeredImage *)&initial;
  }
  std::__cxx11::string::~string((string *)this_01);
  pcVar17 = "ivec2(gx, gy)";
  pcVar18 = "ivec3(gx, gy, gz)";
  if (pBVar11->m_imageType == TEXTURETYPE_2D) {
    pcVar18 = "ivec2(gx, gy)";
  }
  __s = "gx";
  if (pBVar11->m_imageType != TEXTURETYPE_BUFFER) {
    __s = pcVar18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invocationCoord,__s,(allocator<char> *)&initial);
  pbVar15 = (bool *)0x171e7c8;
  if (CVar7 - SIGNED_INT8 < 3) {
    pbVar15 = glcts::fixed_sample_locations_values + 1;
  }
  pbVar21 = (bool *)0x16e9d50;
  if (CVar7 != UNSIGNED_INT32 && bVar23) {
    pbVar21 = pbVar15;
  }
  AVar8 = pBVar11->m_operation;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"gx",(allocator<char> *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"gy",(allocator<char> *)&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"gz",(allocator<char> *)&local_3d0);
  iVar20 = local_7a8.m_data[1];
  iVar22 = local_7a8.m_data[0] * 5;
  if (AVar8 < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_6a8,"(",&local_5e8);
    std::operator+(&local_688,&local_6a8,"*");
    std::operator+(&local_668,&local_688,&local_5e8);
    std::operator+(&local_648,&local_668," + ");
    std::operator+(&glslVersionDeclaration,&local_648,&local_608);
    std::operator+(&shaderImageTypeStr,&glslVersionDeclaration,"*");
    std::operator+(&shaderImageFormatStr,&shaderImageTypeStr,&local_608);
    std::operator+(&atomicInvocation,&shaderImageFormatStr," + ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
                   &atomicInvocation,&local_628);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
                   "*");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                   &local_628);
    std::operator+(&local_5c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,")"
                  );
    std::__cxx11::string::~string((string *)&initial);
    std::__cxx11::string::~string((string *)&imageData);
    std::__cxx11::string::~string((string *)local_6e0);
    std::__cxx11::string::~string((string *)&atomicInvocation);
    std::__cxx11::string::~string((string *)&shaderImageFormatStr);
    std::__cxx11::string::~string((string *)&shaderImageTypeStr);
    std::__cxx11::string::~string((string *)&glslVersionDeclaration);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_688);
    this_02 = &local_6a8;
  }
  else {
    if (AVar8 != ATOMIC_OPERATION_EXCHANGE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,(char *)0x0,(allocator<char> *)&initial);
      goto LAB_01253fa9;
    }
    std::operator+(&local_668,"((",&local_628);
    std::operator+(&local_648,&local_668,"*");
    local_350._M_dataplus._M_p._0_4_ = iVar22;
    de::toString<int>(&local_688,(int *)&local_350);
    std::operator+(&glslVersionDeclaration,&local_648,&local_688);
    std::operator+(&shaderImageTypeStr,&glslVersionDeclaration," + ");
    std::operator+(&shaderImageFormatStr,&shaderImageTypeStr,&local_5e8);
    std::operator+(&atomicInvocation,&shaderImageFormatStr,")*");
    local_370._M_dataplus._M_p._0_4_ = iVar20;
    de::toString<int>(&local_6a8,(int *)&local_370);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
                   &atomicInvocation,&local_6a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
                   " + ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                   &local_608);
    std::operator+(&local_5c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,")"
                  );
    std::__cxx11::string::~string((string *)&initial);
    std::__cxx11::string::~string((string *)&imageData);
    std::__cxx11::string::~string((string *)local_6e0);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&atomicInvocation);
    std::__cxx11::string::~string((string *)&shaderImageFormatStr);
    std::__cxx11::string::~string((string *)&shaderImageTypeStr);
    std::__cxx11::string::~string((string *)&glslVersionDeclaration);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_648);
    this_02 = &local_668;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_01253fa9:
  std::operator+(&atomicArgExpr,pbVar21,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
  glslVersionDeclaration._M_string_length = 0;
  glslVersionDeclaration.field_2._M_local_buf[0] = '\0';
  if ((ulong)pBVar11->m_operation < 8) {
    pcVar17 = &DAT_0189f884;
    pcVar18 = &DAT_0189f884 + *(int *)(&DAT_0189f884 + (ulong)pBVar11->m_operation * 4);
  }
  else {
    pcVar18 = (char *)0x0;
  }
  std::operator+(&shaderImageTypeStr,&glslVersionDeclaration,pcVar18);
  std::operator+(&shaderImageFormatStr,&shaderImageTypeStr,"(u_results, ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,
                 &shaderImageFormatStr,&atomicCoord);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0,", "
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
                 &atomicArgExpr);
  std::operator+(&atomicInvocation,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initial,")");
  std::__cxx11::string::~string((string *)&initial);
  std::__cxx11::string::~string((string *)&imageData);
  std::__cxx11::string::~string((string *)local_6e0);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)local_6b8,format);
  getShaderImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(pBVar11->m_format).type,pBVar11->m_imageType,
             (TextureType)pcVar17);
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_00 + 0x10))(this_00);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar18 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar18,(allocator<char> *)&initial);
  memset(&imageData,0,0xac);
  std::operator+(&local_b0,&glslVersionDeclaration,"\n");
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_d0,this_00,renderContext);
  std::operator+(&local_3d0,&local_b0,&local_d0);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_f0,(Functional *)(ulong)pBVar11->m_imageType,(TextureType)this_00,
             (RenderContext *)pcVar17);
  std::operator+(&local_3b0,&local_3d0,&local_f0);
  std::operator+(&local_390,&local_3b0,"\nprecision highp ");
  std::operator+(&local_370,&local_390,&shaderImageTypeStr);
  std::operator+(&local_350,&local_370,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_628,&local_350,&shaderImageFormatStr);
  std::operator+(&local_608,&local_628,", binding=0) coherent uniform ");
  std::operator+(&local_5e8,&local_608,&shaderImageTypeStr);
  std::operator+(&local_5c8,&local_5e8," u_results;\n");
  AVar9 = pBVar11->m_caseType;
  if (AVar9 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_130,"layout (",&shaderImageFormatStr);
    std::operator+(&local_110,&local_130,", binding=1) writeonly uniform ");
    std::operator+(&local_410,&local_110,&shaderImageTypeStr);
    std::operator+(&local_3f0,&local_410," u_returnValues;\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_410);
  }
  std::operator+(&local_6a8,&local_5c8,&local_3f0);
  std::operator+(&local_688,&local_6a8,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = int(gl_GlobalInvocationID.z);\n"
                );
  AVar10 = pBVar11->m_caseType;
  if (AVar10 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_1b0,"\timageStore(u_returnValues, ",&invocationCoord);
    std::operator+(&local_190,&local_1b0,", ");
    std::operator+(&local_170,&local_190,&colorVecTypeName);
    std::operator+(&local_150,&local_170,"(");
    std::operator+(&local_578,&local_150,&atomicInvocation);
    std::operator+(&local_520,&local_578,"));\n");
    bVar23 = false;
  }
  else if (AVar10 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
    std::operator+(&local_578,"\t",&atomicInvocation);
    std::operator+(&local_520,&local_578,";\n");
    bVar23 = true;
  }
  else {
    bVar23 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,(char *)0x0,(allocator<char> *)&local_578);
  }
  std::operator+(&local_668,&local_688,&local_520);
  std::operator+(&local_648,&local_668,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)local_6e0,&local_648);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&imageData,(ShaderSource *)local_6e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&initial,(RenderContext *)this_00,sources);
  std::__cxx11::string::~string((string *)(local_6e0 + 8));
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_520);
  if (bVar23) {
    std::__cxx11::string::~string((string *)&local_578);
  }
  if (AVar10 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_3f0);
  if (AVar9 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&imageData);
  uVar16 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  imageData.m_tex2D.m_state = (SharedPtrStateBase *)&imageData.m_texBuffer.m_state;
  imageData.m_type = (TextureType)uVar16;
  imageData.m_size.m_data[0] = (int)((ulong)uVar16 >> 0x20);
  imageData.m_size.m_data[1] = (int)local_798;
  imageData.m_size.m_data[2] = (int)((ulong)local_798 >> 0x20);
  imageData.m_texBuffer.m_state._0_4_ = 0;
  imageData.m_tex2D.m_ptr = (Texture2D *)0x0;
  imageData.m_texCube.m_state = (SharedPtrStateBase *)0x0;
  imageData.m_texCube.m_ptr = (TextureCube *)imageData.m_tex2D.m_state;
  glu::operator<<(local_798,(ShaderProgram *)&initial);
  if (local_270 == false) {
    tcu::TestContext::setTestResult
              ((pBVar11->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
               ,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_298);
    glu::CallLogWrapper::glDispatchCompute
              (&glLog,local_7a8.m_data[0] * 5,local_7a8.m_data[1],local_78c);
    lVar14 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar12 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar12,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x810);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&imageData.m_texBuffer);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&initial);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  std::__cxx11::string::~string((string *)&atomicInvocation);
  std::__cxx11::string::~string((string *)&atomicArgExpr);
  std::__cxx11::string::~string((string *)&invocationCoord);
  std::__cxx11::string::~string((string *)&atomicCoord);
  std::__cxx11::string::~string((string *)&colorVecTypeName);
  if (local_270 != false) {
    AVar9 = pBVar11->m_caseType;
    dVar12 = returnValueTextureBuf.super_ObjectWrapper.m_object;
    dVar13 = returnValueTexture.super_ObjectWrapper.m_object;
    if ((AVar9 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) &&
       (dVar12 = endResultTextureBuf.super_ObjectWrapper.m_object,
       dVar13 = endResultTexture.super_ObjectWrapper.m_object,
       AVar9 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT)) {
      dVar12 = 0xffffffff;
      dVar13 = 0xffffffff;
    }
    imageData.m_type = (uint)(AVar9 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) * 4 + TEXTURETYPE_CUBE
    ;
    imageData.m_size.m_data[0] = 1;
    imageData.m_size.m_data[1] = 1;
    tcu::operator*((tcu *)&initial,&local_7a8,(Vector<int,_3> *)&imageData);
    if (pBVar11->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x18);
      imageData.m_type = local_7a8.m_data[0];
      imageData.m_size.m_data[0] = local_7a8.m_data[1];
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___01e4b3f0;
      uVar3 = pBVar11->m_imageType;
      uVar5 = pBVar11->m_operation;
      pp_Var24 = (_func_int **)CONCAT44(uVar3,uVar5);
      verifyLayer[1]._vptr_ImageLayerVerifier = pp_Var24;
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(verifyLayer + 2),(Vector<int,_2> *)&imageData);
    }
    else if (pBVar11->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___01e4b3b0;
      uVar2 = pBVar11->m_imageType;
      uVar4 = pBVar11->m_operation;
      pp_Var24 = (_func_int **)CONCAT44(uVar2,uVar4);
      verifyLayer[1]._vptr_ImageLayerVerifier = pp_Var24;
    }
    else {
      verifyLayer = (ImageLayerVerifier *)0x0;
    }
    bVar23 = readTextureAndVerify
                       ((RenderContext *)this_00,&glLog,dVar13,dVar12,pBVar11->m_imageType,local_6b8
                        ,(IVec3 *)&initial,verifyLayer);
    pcVar17 = "Image verification failed";
    if (bVar23) {
      pcVar17 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pBVar11->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar23,
               pcVar17);
    (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
  }
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

BinaryAtomicOperationCase::IterateResult BinaryAtomicOperationCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			const IVec4 initial(getOperationInitialValue(m_operation));

			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, initial);
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern (initial value " << getOperationInitialValue(m_operation) << ")" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform image stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string atomicArgExpr			= (isUintFormat		? "uint"
											 : isIntFormat		? ""
											 : "float")
												+ getAtomicFuncArgumentShaderStr(m_operation, "gx", "gy", "gz", IVec2(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y()));
		const string atomicInvocation		= string() + getAtomicOperationShaderFuncName(m_operation) + "(u_results, " + atomicCoord + ", " + atomicArgExpr + ")";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(" + atomicInvocation + "));\n"
														 : m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ?
															"	" + atomicInvocation + ";\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and check.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;
		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		const IVec3									textureToCheckSize	= imageSize * IVec3(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ? 1 : NUM_INVOCATIONS_PER_PIXEL, 1, 1);
		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_operation, m_imageType)
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_operation, m_imageType, imageSize.swizzle(0, 1))
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, textureToCheckSize, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}